

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<(anonymous_namespace)::SwizzleToRGBATestR8_RRRONE_Test>::
CreateTest(TestFactoryImpl<(anonymous_namespace)::SwizzleToRGBATestR8_RRRONE_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x158);
  anon_unknown.dwarf_30c12::SwizzleToRGBATestR8_RRRONE_Test::SwizzleToRGBATestR8_RRRONE_Test
            ((SwizzleToRGBATestR8_RRRONE_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }